

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
 __thiscall
testing::
Return<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>>
          (testing *this,
          ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
          *value)

{
  _Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false> _Var1;
  ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
  *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
  RVar2;
  
  _Var1._M_head_impl =
       (value->payload)._M_t.
       super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
       .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
       _M_head_impl;
  (value->payload)._M_t.
  super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
  _M_head_impl = (StrictMock<solitaire::archivers::SnapshotMock> *)0x0;
  __p = (ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
         *)operator_new(8);
  (__p->payload)._M_t.
  super___uniq_ptr_impl<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  .super__Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false>.
  _M_head_impl = _Var1._M_head_impl;
  *(ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
    **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  RVar2.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar2.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
          )RVar2.value_.
           super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}